

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O3

obj * o_in(obj *obj,char oclass)

{
  obj *obj_00;
  obj *poVar1;
  
  if (obj->oclass != oclass) {
    for (obj_00 = obj->cobj; obj_00 != (obj *)0x0; obj_00 = obj_00->nobj) {
      if (obj_00->oclass == oclass) {
        return obj_00;
      }
      if ((obj_00->cobj != (obj *)0x0) && (poVar1 = o_in(obj_00,oclass), poVar1 != (obj *)0x0)) {
        return poVar1;
      }
    }
    obj = (obj *)0x0;
  }
  return obj;
}

Assistant:

static struct obj *o_in(struct obj *obj, char oclass)
{
    struct obj *otmp;
    struct obj *temp;

    if (obj->oclass == oclass) return obj;

    if (Has_contents(obj)) {
	for (otmp = obj->cobj; otmp; otmp = otmp->nobj)
	    if (otmp->oclass == oclass) return otmp;
	    else if (Has_contents(otmp) && (temp = o_in(otmp, oclass)))
		return temp;
    }
    return NULL;
}